

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pointer.h
# Opt level: O2

ICommand * __thiscall
GenApi_3_4::CPointer<GenApi_3_4::ICommand,_GenApi_3_4::IBase>::operator->
          (CPointer<GenApi_3_4::ICommand,_GenApi_3_4::IBase> *this)

{
  ExceptionReporter<GenICam_3_4::LogicalErrorException> *this_00;
  ExceptionReporter<GenICam_3_4::LogicalErrorException> local_c0;
  
  if (this->m_pT != (ICommand *)0x0) {
    return this->m_pT;
  }
  this_00 = (ExceptionReporter<GenICam_3_4::LogicalErrorException> *)__cxa_allocate_exception(0x1f0)
  ;
  GenICam_3_4::ExceptionReporter<GenICam_3_4::LogicalErrorException>::ExceptionReporter
            (&local_c0,
             "/workspace/llm4binary/github/license_c_cmakelists/roboception[P]rc_genicam_api/genicam/library/CPP/include/GenApi/Pointer.h"
             ,0x6a,"LogicalErrorException");
  GenICam_3_4::ExceptionReporter<GenICam_3_4::LogicalErrorException>::Report
            (this_00,(char *)&local_c0,"NULL pointer dereferenced");
  __cxa_throw(this_00,&GenICam_3_4::LogicalErrorException::typeinfo,
              GenICam_3_4::GenericException::~GenericException);
}

Assistant:

T* operator->(void) const
        {
            if (NULL == m_pT)
                throw LOGICAL_ERROR_EXCEPTION( "NULL pointer dereferenced" );
            return m_pT;
        }